

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollable.c
# Opt level: O1

int nni_pollable_getfd(nni_pollable *p,int *fdp)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  uint64_t uVar4;
  int unaff_R15D;
  uint local_38;
  int local_34;
  int rfd;
  int wfd;
  
  if (p == (nni_pollable *)0x0) {
    unaff_R15D = 3;
  }
  else {
    do {
      uVar4 = nni_atomic_get64(&p->p_fds);
      if (uVar4 == 0xffffffffffffffff) {
        iVar3 = nni_plat_pipe_open(&local_34,(int *)&local_38);
        if (iVar3 == 0) {
          _Var2 = nni_atomic_cas64(&p->p_fds,0xffffffffffffffff,
                                   ((ulong)local_38 << 0x20) + (long)local_34);
          if (_Var2) {
            _Var2 = nni_atomic_get_bool(&p->p_raised);
            if (_Var2) {
              nni_plat_pipe_raise(local_34);
            }
            *fdp = local_38;
            goto LAB_0012728e;
          }
          nni_plat_pipe_close(local_34,local_38);
          bVar1 = true;
        }
        else {
          bVar1 = false;
          unaff_R15D = iVar3;
        }
      }
      else {
        *fdp = (int)(uVar4 >> 0x20);
LAB_0012728e:
        bVar1 = false;
        unaff_R15D = 0;
      }
    } while (bVar1);
  }
  return unaff_R15D;
}

Assistant:

int
nni_pollable_getfd(nni_pollable *p, int *fdp)
{
	if (p == NULL) {
		return (NNG_EINVAL);
	}

	for (;;) {
		int      rfd;
		int      wfd;
		int      rv;
		uint64_t fds;

		if ((fds = nni_atomic_get64(&p->p_fds)) != (uint64_t) -1) {
			*fdp = RFD(fds);
			return (0);
		}
		if ((rv = nni_plat_pipe_open(&wfd, &rfd)) != 0) {
			return (rv);
		}
		fds = FD_JOIN(wfd, rfd);

		if (nni_atomic_cas64(&p->p_fds, (uint64_t) -1, fds)) {
			if (nni_atomic_get_bool(&p->p_raised)) {
				nni_plat_pipe_raise(wfd);
			}
			*fdp = rfd;
			return (0);
		}

		// Someone beat us.  Close ours, and try again.
		nni_plat_pipe_close(wfd, rfd);
	}
}